

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,QString *extraMessage)

{
  QAbstractSocketEngine *this_00;
  long lVar1;
  SocketError error;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QArrayData *local_68 [3];
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  switch(state) {
  case Uninitialized:
  case AuthenticationMethodsSent:
  case Authenticating:
  case RequestMethodSent:
  case Connected:
  case UdpAssociateSuccess:
  case BindSuccess:
    goto switchD_00238272_caseD_0;
  case ConnectError:
  case ControlSocketError:
    error = QAbstractSocket::error(&this->data->controlSocket->super_QAbstractSocket);
    if (this->socks5State == Connected) {
switchD_0023835a_caseD_3:
      QIODevice::errorString();
    }
    else {
      switch(error) {
      case ConnectionRefusedError:
        QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c4a3);
        error = ProxyConnectionRefusedError;
        break;
      case RemoteHostClosedError:
        QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c4bf);
        error = ProxyConnectionClosedError;
        break;
      case HostNotFoundError:
        QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c4e6);
        error = ProxyNotFoundError;
        break;
      default:
        goto switchD_0023835a_caseD_3;
      case SocketTimeoutError:
        if (state != ConnectError) goto switchD_0023835a_caseD_3;
        QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c4fb);
        error = ProxyConnectionTimeoutError;
      }
    }
    break;
  case AuthenticatingError:
    lVar1 = (extraMessage->d).size;
    if (lVar1 == 0) {
      QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c519);
    }
    else {
      QMetaObject::tr((char *)local_68,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c535);
      QVar2.m_size = (size_t)local_68;
      QVar2.field_0.m_data = &local_50;
      QString::arg_impl(QVar2,(int)(extraMessage->d).ptr,(QChar)(char16_t)(extraMessage->d).size);
    }
    QAbstractSocketEngine::setError(this_00,ProxyAuthenticationRequiredError,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((lVar1 == 0) || (local_68[0] == (QArrayData *)0x0)) goto switchD_00238272_caseD_6;
    LOCK();
    (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_00238272_caseD_6;
    goto LAB_0023832d;
  default:
    goto switchD_00238272_caseD_6;
  case SocksError:
    QMetaObject::tr((char *)&local_50,(char *)&QSocks5SocketEngine::staticMetaObject,0x27c555);
    error = ProxyProtocolError;
    break;
  case HostNameLookupError:
    QMetaObject::tr((char *)&local_50,(char *)&QAbstractSocket::staticMetaObject,0x25ddaa);
    error = HostNotFoundError;
  }
  QAbstractSocketEngine::setError(this_00,error,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    local_68[0] = &(local_50.d.d)->super_QArrayData;
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0023832d:
      QArrayData::deallocate(local_68[0],2,0x10);
    }
  }
switchD_00238272_caseD_6:
  QAbstractSocketEngine::setState(this_00,UnconnectedState);
  this->socks5State = state;
switchD_00238272_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, const QString &extraMessage)
{
    Q_Q(QSocks5SocketEngine);

    switch (state) {
    case Uninitialized:
    case Authenticating:
    case AuthenticationMethodsSent:
    case RequestMethodSent:
    case Connected:
    case UdpAssociateSuccess:
    case BindSuccess:
        // these aren't error states
        return;

    case ConnectError:
    case ControlSocketError: {
        QAbstractSocket::SocketError controlSocketError = data->controlSocket->error();
        if (socks5State != Connected) {
            switch (controlSocketError) {
            case QAbstractSocket::ConnectionRefusedError:
                q->setError(QAbstractSocket::ProxyConnectionRefusedError,
                             QSocks5SocketEngine::tr("Connection to proxy refused"));
                break;
            case QAbstractSocket::RemoteHostClosedError:
                q->setError(QAbstractSocket::ProxyConnectionClosedError,
                             QSocks5SocketEngine::tr("Connection to proxy closed prematurely"));
                break;
            case QAbstractSocket::HostNotFoundError:
                q->setError(QAbstractSocket::ProxyNotFoundError,
                             QSocks5SocketEngine::tr("Proxy host not found"));
                break;
            case QAbstractSocket::SocketTimeoutError:
                if (state == ConnectError) {
                    q->setError(QAbstractSocket::ProxyConnectionTimeoutError,
                                 QSocks5SocketEngine::tr("Connection to proxy timed out"));
                    break;
                }
                Q_FALLTHROUGH();
            default:
                q->setError(controlSocketError, data->controlSocket->errorString());
                break;
            }
        } else {
            q->setError(controlSocketError, data->controlSocket->errorString());
        }
        break;
    }

    case AuthenticatingError:
        q->setError(QAbstractSocket::ProxyAuthenticationRequiredError,
                    extraMessage.isEmpty() ?
                     QSocks5SocketEngine::tr("Proxy authentication failed") :
                     QSocks5SocketEngine::tr("Proxy authentication failed: %1").arg(extraMessage));
        break;

    case RequestError:
        // error code set by caller (overload)
        break;

    case SocksError:
        q->setError(QAbstractSocket::ProxyProtocolError,
                     QSocks5SocketEngine::tr("SOCKS version 5 protocol error"));
        break;

    case HostNameLookupError:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    }

    q->setState(QAbstractSocket::UnconnectedState);
    socks5State = state;
}